

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void roundFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  char *pcVar1;
  i64 iVar2;
  char *z;
  uint uVar3;
  long lVar4;
  uint uVar5;
  double val;
  double local_28;
  
  uVar5 = 0;
  if (argc == 2) {
    if (argv[1]->type == '\x05') {
      return;
    }
    iVar2 = sqlite3VdbeIntValue(argv[1]);
    uVar3 = 0x1e;
    if ((int)(uint)iVar2 < 0x1e) {
      uVar3 = (uint)iVar2;
    }
    uVar5 = 0;
    if (0 < (int)uVar3) {
      uVar5 = uVar3;
    }
  }
  if ((*argv)->type != '\x05') {
    local_28 = sqlite3VdbeRealValue(*argv);
    if (((uVar5 != 0) || (local_28 < 0.0)) || (9.223372036854776e+18 <= local_28)) {
      if (((uVar5 != 0) || (0.0 <= local_28)) || (local_28 <= -9.223372036854776e+18)) {
        z = sqlite3_mprintf("%.*f",(ulong)uVar5);
        if (z == (char *)0x0) {
          sqlite3VdbeMemSetNull(&context->s);
          context->isError = 7;
          ((context->s).db)->mallocFailed = '\x01';
          return;
        }
        lVar4 = 0;
        do {
          pcVar1 = z + lVar4;
          lVar4 = lVar4 + 1;
        } while (*pcVar1 != '\0');
        sqlite3AtoF(z,&local_28,(int)lVar4 - 1U & 0x3fffffff,'\x01');
        sqlite3_free(z);
        val = local_28;
      }
      else {
        val = -(double)(long)(0.5 - local_28);
      }
    }
    else {
      val = (double)(long)(local_28 + 0.5);
    }
    sqlite3VdbeMemSetDouble(&context->s,val);
    return;
  }
  return;
}

Assistant:

static void roundFunc(sqlite3_context *context, int argc, sqlite3_value **argv){
  int n = 0;
  double r;
  char *zBuf;
  assert( argc==1 || argc==2 );
  if( argc==2 ){
    if( SQLITE_NULL==sqlite3_value_type(argv[1]) ) return;
    n = sqlite3_value_int(argv[1]);
    if( n>30 ) n = 30;
    if( n<0 ) n = 0;
  }
  if( sqlite3_value_type(argv[0])==SQLITE_NULL ) return;
  r = sqlite3_value_double(argv[0]);
  /* If Y==0 and X will fit in a 64-bit int,
  ** handle the rounding directly,
  ** otherwise use printf.
  */
  if( n==0 && r>=0 && r<LARGEST_INT64-1 ){
    r = (double)((sqlite_int64)(r+0.5));
  }else if( n==0 && r<0 && (-r)<LARGEST_INT64-1 ){
    r = -(double)((sqlite_int64)((-r)+0.5));
  }else{
    zBuf = sqlite3_mprintf("%.*f",n,r);
    if( zBuf==0 ){
      sqlite3_result_error_nomem(context);
      return;
    }
    sqlite3AtoF(zBuf, &r, sqlite3Strlen30(zBuf), SQLITE_UTF8);
    sqlite3_free(zBuf);
  }
  sqlite3_result_double(context, r);
}